

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O2

Expression __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::BuildGraph
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          vector<int,_std::allocator<int>_> *target,ComputationGraph *cg,Expression *alignment,
          vector<int,_std::allocator<int>_> *ctx,Expression *coverage,Expression *fertility)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  undefined8 extraout_RDX;
  uint t;
  ulong uVar5;
  Expression EVar6;
  undefined8 *in_stack_00000018;
  Expression i_r_t;
  Expression mu_trim;
  Expression local_158;
  Expression var_trim;
  Expression var;
  Expression mu;
  Expression local_118;
  Expression vbias;
  Expression i_penalty;
  Expression i_err;
  Expression local_c8;
  Expression partition;
  Expression delta;
  Expression mbias;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> errs;
  Expression i_total_trim;
  Expression local_60;
  Expression exponent;
  Expression i_totals;
  
  start_new_instance((AttentionalModel<dynet::LSTMBuilder> *)source,target,
                     (ComputationGraph *)alignment,(vector<int,_std::allocator<int>_> *)coverage);
  errs.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  errs.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  errs.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = *(long *)(cg + 8);
  lVar4 = *(long *)cg;
  for (uVar5 = 0; (int)((ulong)(lVar3 - lVar4) >> 2) - 1 != uVar5; uVar5 = uVar5 + 1) {
    add_input((AttentionalModel<dynet::LSTMBuilder> *)&i_r_t,(int)source,
              *(int *)(*(long *)cg + uVar5 * 4),(ComputationGraph *)(uVar5 & 0xffffffff),
              (RNNPointer *)alignment);
    dynet::expr::pickneglogsoftmax(&i_err,(uint)(AttentionalModel<dynet::LSTMBuilder> *)&i_r_t);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::push_back
              (&errs,&i_err);
  }
  if (ctx == (vector<int,_std::allocator<int>_> *)0x0) {
    if (fertility == (Expression *)0x0 && in_stack_00000018 == (undefined8 *)0x0) goto LAB_0012ba7a;
    expr::detail::
    f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((detail *)&i_err,
               (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               &source[0x30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  else {
    expr::detail::
    f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((detail *)&i_r_t,
               (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               &source[0x30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    (ctx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)i_r_t.pg;
    *(uint *)&(ctx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish = i_r_t.i.t;
    if (fertility == (Expression *)0x0 && in_stack_00000018 == (undefined8 *)0x0) goto LAB_0012ba7a;
    i_err.pg = i_r_t.pg;
    i_err.i = i_r_t.i;
  }
  dynet::expr::sum_cols(&i_totals);
  dynet::expr::pickrange(&i_total_trim,(uint)&i_totals,1);
  if (fertility != (Expression *)0x0) {
    iVar1 = *(int *)((long)&source[0x32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4);
    auxiliary_vector((AttentionalModel<dynet::LSTMBuilder> *)source);
    repeat((ComputationGraph *)&i_r_t,(uint)alignment,1.0,
           (vector<float,_std::allocator<float>_> *)(ulong)(iVar1 - 2));
    dynet::expr::squared_distance(&i_penalty,&i_total_trim);
    fertility->pg = i_penalty.pg;
    (fertility->i).t = i_penalty.i.t;
  }
  if (in_stack_00000018 != (undefined8 *)0x0) {
    if (*(char *)((long)&source[0x26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 5) == '\0') {
      __assert_fail("global_fertility",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.h"
                    ,0x1c4,
                    "Expression dynet::AttentionalModel<dynet::LSTMBuilder>::BuildGraph(const std::vector<int> &, const std::vector<int> &, ComputationGraph &, Expression *, const std::vector<int> *, Expression *, Expression *) [Builder = dynet::LSTMBuilder]"
                   );
    }
    uVar2 = *(uint *)((long)&source[0x32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4);
    dynet::expr::parameter
              (&mbias,alignment,
               source[10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               source[10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&i_r_t,
               (ulong)uVar2,&mbias,(allocator_type *)&vbias);
    expr::detail::
    f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((detail *)&i_penalty,
               (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&i_r_t);
    std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
    ~_Vector_base((_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *
                  )&i_r_t);
    uVar2 = *(uint *)((long)&source[0x32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4);
    dynet::expr::parameter
              (&vbias,alignment,
               source[0xb].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               source[0xb].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&i_r_t,
               (ulong)uVar2,&vbias,(allocator_type *)&mu);
    expr::detail::
    f<dynet::Concatenate,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((detail *)&mbias,
               (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&i_r_t);
    std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
    ~_Vector_base((_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *
                  )&i_r_t);
    uVar2 = *(uint *)((long)&source[0x32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4);
    dynet::expr::parameter
              (&mu,alignment,
               source[0xb].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               source[0xc].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&i_r_t,
               (ulong)uVar2,&mu,(allocator_type *)&var);
    expr::detail::
    f<dynet::Concatenate,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((detail *)&vbias,
               (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&i_r_t);
    std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
    ~_Vector_base((_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *
                  )&i_r_t);
    dynet::expr::parameter
              (&var_trim,alignment,
               source[8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               source[8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    dynet::expr::operator*(&mu_trim,&var_trim);
    dynet::expr::operator+(&var,&i_penalty);
    dynet::expr::transpose(&mu);
    dynet::expr::tanh(&i_r_t);
    dynet::expr::parameter
              (&mu_trim,alignment,
               source[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               source[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    dynet::expr::operator*(&var,&i_r_t);
    dynet::expr::operator+(&mu,&mbias);
    dynet::expr::parameter
              (&delta,alignment,
               source[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               source[10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dynet::expr::operator*(&var_trim,&i_r_t);
    dynet::expr::operator+(&mu_trim,&vbias);
    dynet::expr::exp(&var);
    dynet::expr::pickrange(&mu_trim,(uint)&mu,1);
    dynet::expr::pickrange(&var_trim,(uint)&var,1);
    dynet::expr::operator-(&delta,&i_total_trim);
    dynet::expr::cmult(&local_158,&delta);
    dynet::expr::operator-((expr *)&partition,&local_158);
    dynet::expr::operator*(&local_118,2.0);
    dynet::expr::cdiv(&exponent,&partition);
    dynet::expr::operator*(&local_c8,2.0);
    dynet::expr::operator*(&local_118,3.1415927);
    dynet::expr::log(&local_158);
    dynet::expr::operator*(&partition,-0.5);
    dynet::expr::operator+(&local_60,&partition);
    dynet::expr::transpose(&local_c8);
    dynet::expr::sum_cols(&local_118);
    dynet::expr::operator-((expr *)&local_158,&local_118);
    *in_stack_00000018 = local_158.pg;
    *(uint *)(in_stack_00000018 + 1) = local_158.i.t;
  }
LAB_0012ba7a:
  expr::detail::
  f<dynet::Sum,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((detail *)this,&errs);
  std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
  ~_Vector_base(&errs.
                 super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
               );
  EVar6._8_8_ = extraout_RDX;
  EVar6.pg = (ComputationGraph *)this;
  return EVar6;
}

Assistant:

Expression AttentionalModel<Builder>::BuildGraph(const std::vector<int> &source,
        const std::vector<int>& target, ComputationGraph& cg, Expression *alignment,
        const std::vector<int>* ctx, Expression *coverage, Expression *fertility) 
{
    //std::cout << "source sentence length: " << source.size() << " target: " << target.size() << std::endl;
    start_new_instance(source, cg, ctx);

    std::vector<Expression> errs;
    const unsigned tlen = target.size() - 1; 
    for (unsigned t = 0; t < tlen; ++t) {
        Expression i_r_t = add_input(target[t], t, cg);
        Expression i_err = pickneglogsoftmax(i_r_t, target[t+1]);
        errs.push_back(i_err);
    }
    // save the alignment for later
    if (alignment != 0) {
	// pop off the last alignment column
        *alignment = concatenate_cols(aligns);
    }

    // AM paper (vision one) has a penalty over alignment rows deviating from 1
    if (coverage != nullptr || fertility != nullptr) {
        Expression i_aligns = (alignment != 0) ? *alignment : concatenate_cols(aligns);
        Expression i_totals = sum_cols(i_aligns);
        // only care about the non-null entries
        Expression i_total_trim = pickrange(i_totals, 1, slen-1);

        if (coverage != nullptr) {
            Expression i_ones = repeat(cg, slen-2, 1.0f, auxiliary_vector());
            Expression i_penalty = squared_distance(i_total_trim, i_ones);
            *coverage = i_penalty;
        } 

        if (fertility != nullptr) {
            assert(global_fertility);

            Expression fbias = concatenate_cols(std::vector<Expression>(slen, parameter(cg, p_bfhid)));
            Expression mbias = concatenate(std::vector<Expression>(slen, parameter(cg, p_bfmu)));
            Expression vbias = concatenate(std::vector<Expression>(slen, parameter(cg, p_bfvar)));
            Expression fhid = tanh(transpose(fbias + parameter(cg, p_Wfhid) * src));  
            Expression mu = mbias + fhid * parameter(cg, p_Wfmu);
            Expression var = exp(vbias + fhid * parameter(cg, p_Wfvar));

            Expression mu_trim = pickrange(mu, 1, slen-1);
            Expression var_trim = pickrange(var, 1, slen-1);

#if 0
            /* log-Normal distribution */
            Expression log_fert = log(i_total_trim);
            Expression delta = log_fert - mu_trim;
            Expression exponent = cdiv(-cmult(delta, delta), 2.0f * var_trim);
            Expression partition = -log_fert - 0.5 * log(2.0f * var_trim * 3.14159265359);
            *fertility = -sum_cols(transpose(partition + exponent));
#else
            /* Normal distribution */
            Expression delta = i_total_trim - mu_trim;
            Expression exponent = cdiv(-cmult(delta, delta), 2.0f * var_trim);
            Expression partition = -0.5 * log(2.0f * var_trim * 3.14159265359);
            *fertility = -sum_cols(transpose(partition + exponent));
            // note that as this is the value of the normal density, the errors
            // are not strictly positive
#endif

            //LOLCAT(transpose(i_total_trim));
            //LOLCAT(transpose(mu_trim));
            //LOLCAT(transpose(var_trim));
            //LOLCAT(transpose(partition + exponent));
            //LOLCAT(exp(transpose(partition + exponent)));
        }
    }

    Expression i_nerr = sum(errs);
    return i_nerr;
}